

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cpp
# Opt level: O0

shared_ptr<index_tree> __thiscall dfa::create_index_tree(dfa *this,wchar_t key)

{
  bool bVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  element_type *in_RDI;
  pair<std::__detail::_Node_iterator<std::pair<const_wchar_t,_std::shared_ptr<index_tree>_>,_false,_false>,_bool>
  pVar3;
  shared_ptr<index_tree> sVar4;
  iterator iter;
  shared_ptr<index_tree> *tree;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  shared_ptr<index_tree> *in_stack_ffffffffffffff90;
  element_type *this_00;
  _Node_iterator_base<std::pair<const_wchar_t,_std::shared_ptr<index_tree>_>,_false> local_28;
  _Node_iterator_base<std::pair<const_wchar_t,_std::shared_ptr<index_tree>_>,_false> local_20 [4];
  
  this_00 = in_RDI;
  local_20[0]._M_cur =
       (__node_type *)
       std::
       unordered_map<wchar_t,_std::shared_ptr<index_tree>,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_std::shared_ptr<index_tree>_>_>_>
       ::find((unordered_map<wchar_t,_std::shared_ptr<index_tree>,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_std::shared_ptr<index_tree>_>_>_>
               *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88),(key_type *)0x1137a3)
  ;
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<wchar_t,_std::shared_ptr<index_tree>,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_std::shared_ptr<index_tree>_>_>_>
       ::end((unordered_map<wchar_t,_std::shared_ptr<index_tree>,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_std::shared_ptr<index_tree>_>_>_>
              *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
  bVar1 = std::__detail::operator==(local_20,&local_28);
  if (bVar1) {
    std::make_shared<index_tree>();
    pVar3 = std::
            unordered_map<wchar_t,std::shared_ptr<index_tree>,std::hash<wchar_t>,std::equal_to<wchar_t>,std::allocator<std::pair<wchar_t_const,std::shared_ptr<index_tree>>>>
            ::emplace<wchar_t&,std::shared_ptr<index_tree>&>
                      ((unordered_map<wchar_t,_std::shared_ptr<index_tree>,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<std::pair<const_wchar_t,_std::shared_ptr<index_tree>_>_>_>
                        *)this_00,(wchar_t *)in_RDI,in_stack_ffffffffffffff90);
    _Var2._M_pi = pVar3._8_8_;
  }
  else {
    std::__detail::
    _Node_iterator<std::pair<const_wchar_t,_std::shared_ptr<index_tree>_>,_false,_false>::operator->
              ((_Node_iterator<std::pair<const_wchar_t,_std::shared_ptr<index_tree>_>,_false,_false>
                *)0x11384a);
    std::shared_ptr<index_tree>::shared_ptr
              (in_stack_ffffffffffffff90,
               (shared_ptr<index_tree> *)
               CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
    _Var2._M_pi = extraout_RDX;
  }
  sVar4.super___shared_ptr<index_tree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var2._M_pi;
  sVar4.super___shared_ptr<index_tree,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this_00;
  return (shared_ptr<index_tree>)sVar4.super___shared_ptr<index_tree,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<index_tree> dfa::create_index_tree(wchar_t key)
{
    auto iter = index_trees_.find(key);
    if (iter == index_trees_.end())
    {
        auto tree = std::make_shared<index_tree>();
        index_trees_.emplace(key, tree);
        return tree;
    }
    return iter->second;
}